

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkqsort.c
# Opt level: O3

void mkqsort(uchar **a,int n,int depth)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  uchar *puVar4;
  undefined8 uVar5;
  ulong uVar6;
  uchar **ppuVar7;
  uchar **ppuVar8;
  uchar **ppuVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uchar **c;
  long lVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  
  uVar17 = (ulong)(uint)n;
  if (n < 0x14) {
LAB_001de7bb:
    inssort(a,(int)uVar17,depth);
    return;
  }
  do {
    ppuVar8 = a + (uVar17 >> 1 & 0x7fffffff);
    uVar6 = uVar17 & 0xffffffff;
    c = a + (uVar6 - 1);
    ppuVar9 = c;
    ppuVar7 = a;
    if (0x1e < (uint)uVar17) {
      uVar13 = (ulong)((uint)uVar17 & 0xfffffff8);
      uVar17 = (ulong)((uint)(uVar17 >> 2) & 0x3ffffffe);
      ppuVar7 = med3func(a,(uchar **)((long)a + uVar13),a + uVar17,depth);
      ppuVar8 = med3func((uchar **)((long)ppuVar8 - uVar13),ppuVar8,
                         (uchar **)((long)ppuVar8 + uVar13),depth);
      ppuVar9 = med3func(c + -uVar17,(uchar **)((long)c - uVar13),c,depth);
    }
    ppuVar8 = med3func(ppuVar7,ppuVar8,ppuVar9,depth);
    puVar3 = *a;
    *a = *ppuVar8;
    *ppuVar8 = puVar3;
    bVar1 = (*a)[depth];
    ppuVar8 = a + 1;
    ppuVar9 = ppuVar8;
    ppuVar7 = c;
LAB_001de648:
    for (; ppuVar8 <= ppuVar7; ppuVar8 = ppuVar8 + 1) {
      bVar2 = (*ppuVar8)[depth];
      if (bVar1 < bVar2) break;
      if (bVar2 == bVar1) {
        puVar3 = *ppuVar9;
        *ppuVar9 = *ppuVar8;
        *ppuVar8 = puVar3;
        ppuVar9 = ppuVar9 + 1;
      }
    }
    for (; ppuVar8 <= ppuVar7; ppuVar7 = ppuVar7 + -1) {
      puVar3 = *ppuVar7;
      if (puVar3[depth] < bVar1) goto code_r0x001de690;
      if (puVar3[depth] == bVar1) {
        *ppuVar7 = *c;
        *c = puVar3;
        c = c + -1;
      }
    }
    lVar12 = (long)ppuVar9 - (long)a >> 3;
    lVar14 = (long)ppuVar8 - (long)ppuVar9 >> 3;
    if (lVar14 <= lVar12) {
      lVar12 = lVar14;
    }
    uVar11 = (uint)lVar12;
    if (0 < (int)uVar11) {
      uVar10 = uVar11 + 1;
      lVar12 = 0;
      do {
        uVar5 = *(undefined8 *)((long)a + lVar12);
        *(undefined8 *)((long)a + lVar12) =
             *(undefined8 *)((long)ppuVar8 + lVar12 + (ulong)(uVar11 & 0x7fffffff) * -8);
        *(undefined8 *)((long)ppuVar8 + lVar12 + (ulong)(uVar11 & 0x7fffffff) * -8) = uVar5;
        lVar12 = lVar12 + 8;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    uVar17 = (long)c - (long)ppuVar7 >> 3;
    lVar12 = (long)((long)a + (uVar6 * 8 - (long)c)) >> 3;
    uVar10 = (uint)uVar17;
    uVar11 = (int)lVar12 - 1;
    if ((long)uVar17 < lVar12) {
      uVar11 = uVar10;
    }
    if (0 < (int)uVar11) {
      lVar12 = (ulong)(uVar11 & 0x7fffffff) * -8 + uVar6 * 8;
      uVar11 = uVar11 + 1;
      lVar15 = 0;
      do {
        uVar5 = *(undefined8 *)((long)ppuVar8 + lVar15);
        *(undefined8 *)((long)ppuVar8 + lVar15) = *(undefined8 *)((long)a + lVar15 + lVar12);
        *(undefined8 *)((long)a + lVar15 + lVar12) = uVar5;
        lVar15 = lVar15 + 8;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
    if (1 < (int)lVar14) {
      mkqsort(a,(int)lVar14,depth);
    }
    iVar16 = (int)((ulong)((long)ppuVar8 - (long)ppuVar9) >> 3);
    if (a[iVar16][depth] != '\0') {
      mkqsort(a + iVar16,
              (int)((long)a + ((((long)ppuVar9 - (long)a) + uVar6 * 8) - (long)c) >> 3) + -1,
              depth + 1);
    }
    if ((int)uVar10 < 2) {
      return;
    }
    a = a + (uVar6 - (uVar10 & 0x7fffffff));
    if (uVar10 < 0x14) goto LAB_001de7bb;
  } while( true );
code_r0x001de690:
  puVar4 = *ppuVar8;
  *ppuVar8 = puVar3;
  *ppuVar7 = puVar4;
  ppuVar8 = ppuVar8 + 1;
  ppuVar7 = ppuVar7 + -1;
  goto LAB_001de648;
}

Assistant:

void mkqsort(unsigned char **a, int n, int depth)
{   int d, r, partval;
    unsigned char **pa, **pb, **pc, **pd, **pl, **pm, **pn, *t;
    if (n < 20) {
        inssort(a, n, depth);
        return;
    }
    pl = a;
    pm = a + (n/2);
    pn = a + (n-1);
    if (n > 30) { /* On big arrays, pseudomedian of 9 */
        d = (n/8);
        pl = med3(pl, pl+d, pl+2*d);
        pm = med3(pm-d, pm, pm+d);
        pn = med3(pn-2*d, pn-d, pn);
    }
    pm = med3(pl, pm, pn);
    swap2(a, pm);
    partval = ptr2char(a);
    pa = pb = a + 1;
    pc = pd = a + n-1;
    for (;;) {
        while (pb <= pc && (r = ptr2char(pb)-partval) <= 0) {
            if (r == 0) { swap2(pa, pb); pa++; }
            pb++;
        }
        while (pb <= pc && (r = ptr2char(pc)-partval) >= 0) {
            if (r == 0) { swap2(pc, pd); pd--; }
            pc--;
       }
        if (pb > pc) break;
        swap2(pb, pc);
        pb++;
        pc--;
    }
    pn = a + n;
    r = min(pa-a, pb-pa);    vecswap2(a,  pb-r, r);
    r = min(pd-pc, pn-pd-1); vecswap2(pb, pn-r, r);
    if ((r = pb-pa) > 1)
        mkqsort(a, r, depth);
    if (ptr2char(a + r) != 0)
        mkqsort(a + r, pa-a + pn-pd-1, depth+1);
    if ((r = pd-pc) > 1)
        mkqsort(a + n-r, r, depth);
}